

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_inspect(uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  LodePNGInfo *info_00;
  uint checksum;
  uint CRC;
  LodePNGInfo *info;
  uint height;
  uint width;
  size_t insize_local;
  uchar *in_local;
  LodePNGState *state_local;
  uint *h_local;
  uint *w_local;
  
  info_00 = &state->info_png;
  if ((insize == 0) || (in == (uchar *)0x0)) {
    state->error = 0x30;
    w_local._4_4_ = 0x30;
  }
  else if (insize < 0x21) {
    state->error = 0x1b;
    w_local._4_4_ = 0x1b;
  }
  else {
    lodepng_info_cleanup(info_00);
    lodepng_info_init(info_00);
    if (((((*in == 0x89) && (in[1] == 'P')) && (in[2] == 'N')) &&
        ((in[3] == 'G' && (in[4] == '\r')))) &&
       ((in[5] == '\n' && ((in[6] == '\x1a' && (in[7] == '\n')))))) {
      uVar2 = lodepng_chunk_length(in + 8);
      if (uVar2 == 0xd) {
        uVar1 = lodepng_chunk_type_equals(in + 8,"IHDR");
        if (uVar1 == '\0') {
          state->error = 0x1d;
          w_local._4_4_ = 0x1d;
        }
        else {
          uVar2 = lodepng_read32bitInt(in + 0x10);
          uVar3 = lodepng_read32bitInt(in + 0x14);
          if (w != (uint *)0x0) {
            *w = uVar2;
          }
          if (h != (uint *)0x0) {
            *h = uVar3;
          }
          (state->info_png).color.bitdepth = (uint)in[0x18];
          (state->info_png).color.colortype = (uint)in[0x19];
          info_00->compression_method = (uint)in[0x1a];
          (state->info_png).filter_method = (uint)in[0x1b];
          (state->info_png).interlace_method = (uint)in[0x1c];
          if ((uVar2 == 0) || (uVar3 == 0)) {
            state->error = 0x5d;
            w_local._4_4_ = 0x5d;
          }
          else {
            uVar2 = checkColorValidity((state->info_png).color.colortype,
                                       (state->info_png).color.bitdepth);
            state->error = uVar2;
            if (state->error == 0) {
              if (info_00->compression_method == 0) {
                if ((state->info_png).filter_method == 0) {
                  if ((state->info_png).interlace_method < 2) {
                    if ((state->decoder).ignore_crc == 0) {
                      uVar2 = lodepng_read32bitInt(in + 0x1d);
                      uVar3 = lodepng_crc32(in + 0xc,0x11);
                      if (uVar2 != uVar3) {
                        state->error = 0x39;
                        return 0x39;
                      }
                    }
                    w_local._4_4_ = state->error;
                  }
                  else {
                    state->error = 0x22;
                    w_local._4_4_ = 0x22;
                  }
                }
                else {
                  state->error = 0x21;
                  w_local._4_4_ = 0x21;
                }
              }
              else {
                state->error = 0x20;
                w_local._4_4_ = 0x20;
              }
            }
            else {
              w_local._4_4_ = state->error;
            }
          }
        }
      }
      else {
        state->error = 0x5e;
        w_local._4_4_ = 0x5e;
      }
    }
    else {
      state->error = 0x1c;
      w_local._4_4_ = 0x1c;
    }
  }
  return w_local._4_4_;
}

Assistant:

unsigned lodepng_inspect(unsigned* w, unsigned* h, LodePNGState* state,
                         const unsigned char* in, size_t insize) {
  unsigned width, height;
  LodePNGInfo* info = &state->info_png;
  if(insize == 0 || in == 0) {
    CERROR_RETURN_ERROR(state->error, 48); /*error: the given data is empty*/
  }
  if(insize < 33) {
    CERROR_RETURN_ERROR(state->error, 27); /*error: the data length is smaller than the length of a PNG header*/
  }

  /*when decoding a new PNG image, make sure all parameters created after previous decoding are reset*/
  /* TODO: remove this. One should use a new LodePNGState for new sessions */
  lodepng_info_cleanup(info);
  lodepng_info_init(info);

  if(in[0] != 137 || in[1] != 80 || in[2] != 78 || in[3] != 71
     || in[4] != 13 || in[5] != 10 || in[6] != 26 || in[7] != 10) {
    CERROR_RETURN_ERROR(state->error, 28); /*error: the first 8 bytes are not the correct PNG signature*/
  }
  if(lodepng_chunk_length(in + 8) != 13) {
    CERROR_RETURN_ERROR(state->error, 94); /*error: header size must be 13 bytes*/
  }
  if(!lodepng_chunk_type_equals(in + 8, "IHDR")) {
    CERROR_RETURN_ERROR(state->error, 29); /*error: it doesn't start with a IHDR chunk!*/
  }

  /*read the values given in the header*/
  width = lodepng_read32bitInt(&in[16]);
  height = lodepng_read32bitInt(&in[20]);
  /*TODO: remove the undocumented feature that allows to give null pointers to width or height*/
  if(w) *w = width;
  if(h) *h = height;
  info->color.bitdepth = in[24];
  info->color.colortype = (LodePNGColorType)in[25];
  info->compression_method = in[26];
  info->filter_method = in[27];
  info->interlace_method = in[28];

  /*errors returned only after the parsing so other values are still output*/

  /*error: invalid image size*/
  if(width == 0 || height == 0) CERROR_RETURN_ERROR(state->error, 93);
  /*error: invalid colortype or bitdepth combination*/
  state->error = checkColorValidity(info->color.colortype, info->color.bitdepth);
  if(state->error) return state->error;
  /*error: only compression method 0 is allowed in the specification*/
  if(info->compression_method != 0) CERROR_RETURN_ERROR(state->error, 32);
  /*error: only filter method 0 is allowed in the specification*/
  if(info->filter_method != 0) CERROR_RETURN_ERROR(state->error, 33);
  /*error: only interlace methods 0 and 1 exist in the specification*/
  if(info->interlace_method > 1) CERROR_RETURN_ERROR(state->error, 34);

  if(!state->decoder.ignore_crc) {
    unsigned CRC = lodepng_read32bitInt(&in[29]);
    unsigned checksum = lodepng_crc32(&in[12], 17);
    if(CRC != checksum) {
      CERROR_RETURN_ERROR(state->error, 57); /*invalid CRC*/
    }
  }

  return state->error;
}